

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibrary.cpp
# Opt level: O0

FunctionSignature * __thiscall
Jinx::Impl::Library::FindFunctionSignature
          (FunctionSignature *__return_storage_ptr__,Library *this,FunctionSignature *signature)

{
  bool bVar1;
  reference copy;
  __normal_iterator<const_Jinx::Impl::FunctionSignature_*,_std::vector<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>_>
  local_58 [3];
  FunctionSignature *local_40;
  __normal_iterator<const_Jinx::Impl::FunctionSignature_*,_std::vector<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>_>
  local_38;
  __normal_iterator<const_Jinx::Impl::FunctionSignature_*,_std::vector<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>_>
  local_30;
  __normal_iterator<const_Jinx::Impl::FunctionSignature_*,_std::vector<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>_>
  itr;
  lock_guard<std::mutex> lock;
  FunctionSignature *signature_local;
  Library *this_local;
  
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&itr,&this->m_functionMutex);
  local_38._M_current =
       (FunctionSignature *)
       std::
       vector<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>
       ::begin(&this->m_functionList);
  local_40 = (FunctionSignature *)
             std::
             vector<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>
             ::end(&this->m_functionList);
  local_30 = std::
             find<__gnu_cxx::__normal_iterator<Jinx::Impl::FunctionSignature_const*,std::vector<Jinx::Impl::FunctionSignature,Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,4096ul,16ul>>>,Jinx::Impl::FunctionSignature>
                       (local_38,(__normal_iterator<const_Jinx::Impl::FunctionSignature_*,_std::vector<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>_>
                                  )local_40,signature);
  local_58[0]._M_current =
       (FunctionSignature *)
       std::
       vector<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>
       ::end(&this->m_functionList);
  bVar1 = __gnu_cxx::operator==(&local_30,local_58);
  if (bVar1) {
    FunctionSignature::FunctionSignature(__return_storage_ptr__);
  }
  else {
    copy = __gnu_cxx::
           __normal_iterator<const_Jinx::Impl::FunctionSignature_*,_std::vector<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>_>
           ::operator*(&local_30);
    FunctionSignature::FunctionSignature(__return_storage_ptr__,copy);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&itr);
  return __return_storage_ptr__;
}

Assistant:

inline_t FunctionSignature Library::FindFunctionSignature(const FunctionSignature & signature) const
	{
		std::lock_guard<std::mutex> lock(m_functionMutex);
		auto itr = std::find(m_functionList.begin(), m_functionList.end(), signature);
		if (itr == m_functionList.end())
			return FunctionSignature();
		return *itr;
	}